

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

void __thiscall QFormLayout::invalidate(QFormLayout *this)

{
  long lVar1;
  QFormLayoutPrivate *this_00;
  QSize *in_RDI;
  long in_FS_OFFSET;
  QFormLayoutPrivate *d;
  QSize local_18;
  QSize local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QFormLayout *)0x4b7c4a);
  *(uint *)&this_00->field_0xb0 = *(uint *)&this_00->field_0xb0 & 0xfff3ffff | 0x40000;
  *(uint *)&this_00->field_0xb0 = *(uint *)&this_00->field_0xb0 & 0xffcfffff | 0x100000;
  QSize::QSize(in_RDI);
  this_00->minSize = local_10;
  QSize::QSize(in_RDI);
  this_00->prefSize = local_18;
  this_00->formMaxWidth = -1;
  this_00->hfw_width = -1;
  this_00->sh_width = -1;
  this_00->layoutWidth = -1;
  this_00->hfw_sh_height = -1;
  QLayout::invalidate((QLayout *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFormLayout::invalidate()
{
    Q_D(QFormLayout);
    d->dirty = true;
    d->sizesDirty = true;
    d->minSize = QSize();
    d->prefSize = QSize();
    d->formMaxWidth = -1;
    d->hfw_width = -1;
    d->sh_width = -1;
    d->layoutWidth = -1;
    d->hfw_sh_height = -1;
    QLayout::invalidate();
}